

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.h
# Opt level: O3

ApplVerID * FIX::Message::toApplVerID(ApplVerID *__return_storage_ptr__,BeginString *value)

{
  int iVar1;
  string *value_00;
  STRING local_30;
  
  value_00 = &(value->super_StringField).super_FieldBase.m_string;
  iVar1 = std::__cxx11::string::compare((char *)value_00);
  if (iVar1 == 0) {
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"2","");
    (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
         (_func_int **)&PTR__FieldBase_00320f80;
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_tag = 0x468;
    (__return_storage_ptr__->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string,
               local_30._M_dataplus._M_p,local_30._M_dataplus._M_p + local_30._M_string_length);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)value_00);
    if (iVar1 == 0) {
      local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"3","");
      (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
           (_func_int **)&PTR__FieldBase_00320f80;
      (__return_storage_ptr__->super_StringField).super_FieldBase.m_tag = 0x468;
      (__return_storage_ptr__->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string,
                 local_30._M_dataplus._M_p,local_30._M_dataplus._M_p + local_30._M_string_length);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)value_00);
      if (iVar1 == 0) {
        local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"4","");
        (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
             (_func_int **)&PTR__FieldBase_00320f80;
        (__return_storage_ptr__->super_StringField).super_FieldBase.m_tag = 0x468;
        (__return_storage_ptr__->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string,
                   local_30._M_dataplus._M_p,local_30._M_dataplus._M_p + local_30._M_string_length);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)value_00);
        if (iVar1 == 0) {
          local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"5","");
          (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
               (_func_int **)&PTR__FieldBase_00320f80;
          (__return_storage_ptr__->super_StringField).super_FieldBase.m_tag = 0x468;
          (__return_storage_ptr__->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string.
                         field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string
                     ,local_30._M_dataplus._M_p,
                     local_30._M_dataplus._M_p + local_30._M_string_length);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)value_00);
          if (iVar1 != 0) {
            iVar1 = std::__cxx11::string::compare((char *)value_00);
            if (iVar1 == 0) {
              local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_30,&ApplVerID_FIX50,0x2b89fc);
              ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)value_00);
              if (iVar1 == 0) {
                local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"8","");
                ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)value_00);
                if (iVar1 != 0) {
                  ApplVerID::ApplVerID(__return_storage_ptr__,value_00);
                  return __return_storage_ptr__;
                }
                local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
                std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"9","");
                ApplVerID::ApplVerID(__return_storage_ptr__,&local_30);
              }
            }
            goto LAB_00226d0e;
          }
          local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_30,&ApplVerID_FIX44,0x2b89fa);
          (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
               (_func_int **)&PTR__FieldBase_00320f80;
          (__return_storage_ptr__->super_StringField).super_FieldBase.m_tag = 0x468;
          (__return_storage_ptr__->super_StringField).super_FieldBase.m_string._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string.
                         field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_string
                     ,local_30._M_dataplus._M_p,
                     local_30._M_dataplus._M_p + local_30._M_string_length);
        }
      }
    }
  }
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_data._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->super_StringField).super_FieldBase.m_data.field_2;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_data._M_string_length = 0;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_data.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_metrics.m_length = 0;
  (__return_storage_ptr__->super_StringField).super_FieldBase.m_metrics.m_checksum = 0;
  (__return_storage_ptr__->super_StringField).super_FieldBase._vptr_FieldBase =
       (_func_int **)&PTR__FieldBase_00328ff8;
LAB_00226d0e:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static ApplVerID toApplVerID(const BeginString &value) {
    if (value == BeginString_FIX40) {
      return ApplVerID(ApplVerID_FIX40);
    }
    if (value == BeginString_FIX41) {
      return ApplVerID(ApplVerID_FIX41);
    }
    if (value == BeginString_FIX42) {
      return ApplVerID(ApplVerID_FIX42);
    }
    if (value == BeginString_FIX43) {
      return ApplVerID(ApplVerID_FIX43);
    }
    if (value == BeginString_FIX44) {
      return ApplVerID(ApplVerID_FIX44);
    }
    if (value == BeginString_FIX50) {
      return ApplVerID(ApplVerID_FIX50);
    }
    if (value == "FIX.5.0SP1") {
      return ApplVerID(ApplVerID_FIX50_SP1);
    }
    if (value == "FIX.5.0SP2") {
      return ApplVerID(ApplVerID_FIX50_SP2);
    }
    return ApplVerID(ApplVerID(value));
  }